

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

uint ON_MeshNgon::FindPlanarNgons
               (ON_3dPointListRef *vertex_list,ON_MeshFaceList *face_list,uint **vertex_face_map,
               double planar_tolerance,uint minimum_ngon_vertex_count,uint minimum_ngon_face_count,
               bool bAllowHoles,ON_MeshNgonAllocator *NgonAllocator,
               ON_SimpleArray<unsigned_int> *NgonMap,ON_SimpleArray<ON_MeshNgon_*> *Ngons)

{
  void *__dest;
  ON_PlaneEquation e_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint count;
  uint uVar5;
  uint ngon_fi_count;
  NgonNeighbors *pNVar6;
  uint *__src;
  uint *puVar7;
  double dVar8;
  double ngon_vi1_area;
  undefined1 local_208 [8];
  ON_SimpleArray<unsigned_int> ngon_vi1;
  double ngon_vi_area;
  ON_3dPoint local_1d0;
  undefined1 local_1b8 [8];
  ON_Plane ngon_plane;
  uint local_108;
  uint omitted_face_mark;
  uint ngonUnsetIndex;
  int ngonIndex;
  uint *ngonMap;
  bool bCleanUpNgonMap;
  undefined1 auStack_e8 [8];
  ON_PlaneEquation e;
  ON_SimpleArray<NgonNeighbors> ngon_nbr_map;
  ON_SimpleArray<unsigned_int> ngon_fi;
  ON_SimpleArray<unsigned_int> ngon_vi;
  uint ngon_boundary_edge_count;
  uint face_index;
  uint Fvi [4];
  ON_MeshNgon *ngon;
  ON_MeshVertexFaceMap ws_vfmap;
  bool bQuadFaces;
  uint ngon_boundary_index;
  uint face_count;
  uint vertex_count;
  uint NgonsCount0;
  bool bAllowHoles_local;
  uint minimum_ngon_face_count_local;
  uint minimum_ngon_vertex_count_local;
  double planar_tolerance_local;
  uint **vertex_face_map_local;
  ON_MeshFaceList *face_list_local;
  ON_3dPointListRef *vertex_list_local;
  
  uVar3 = ON_SimpleArray<ON_MeshNgon_*>::UnsignedCount(Ngons);
  uVar4 = ON_3dPointListRef::PointCount(vertex_list);
  count = ON_MeshFaceList::FaceCount(face_list);
  ws_vfmap.m_p._4_4_ = 0;
  uVar5 = ON_MeshFaceList::FaceVertexCount(face_list);
  ws_vfmap.m_p._3_1_ = uVar5 == 4;
  ON_MeshVertexFaceMap::ON_MeshVertexFaceMap((ON_MeshVertexFaceMap *)&ngon);
  ON_SimpleArray<unsigned_int>::ON_SimpleArray((ON_SimpleArray<unsigned_int> *)&ngon_fi.m_count);
  ON_SimpleArray<unsigned_int>::ON_SimpleArray
            ((ON_SimpleArray<unsigned_int> *)&ngon_nbr_map.m_count);
  ON_SimpleArray<NgonNeighbors>::ON_SimpleArray((ON_SimpleArray<NgonNeighbors> *)&e.d);
  ON_PlaneEquation::ON_PlaneEquation((ON_PlaneEquation *)auStack_e8);
  bVar1 = false;
  if ((count == 0) || (uVar5 = ON_SimpleArray<unsigned_int>::UnsignedCount(NgonMap), count != uVar5)
     ) {
    ON_SimpleArray<unsigned_int>::SetCount(NgonMap,0);
  }
  if (((count != 0) && (uVar4 != 0)) &&
     ((planar_tolerance_local = (double)vertex_face_map, vertex_face_map != (uint **)0x0 ||
      ((bVar2 = ON_MeshVertexFaceMap::SetFromFaceList
                          ((ON_MeshVertexFaceMap *)&ngon,uVar4,face_list,false), bVar2 &&
       (planar_tolerance_local =
             (double)ON_MeshVertexFaceMap::VertexFaceMap((ON_MeshVertexFaceMap *)&ngon),
       (uint **)planar_tolerance_local != (uint **)0x0)))))) {
    ON_SimpleArray<unsigned_int>::Reserve((ON_SimpleArray<unsigned_int> *)&ngon_fi.m_count,0x80);
    ON_SimpleArray<unsigned_int>::Reserve
              ((ON_SimpleArray<unsigned_int> *)&ngon_nbr_map.m_count,0x80);
    ON_SimpleArray<NgonNeighbors>::Reserve((ON_SimpleArray<NgonNeighbors> *)&e.d,0x80);
    _ngonUnsetIndex = ON_SimpleArray<unsigned_int>::Array(NgonMap);
    uVar4 = ON_SimpleArray<unsigned_int>::UnsignedCount(NgonMap);
    if (count != uVar4) {
      ON_SimpleArray<unsigned_int>::Reserve(NgonMap,(ulong)count);
      ON_SimpleArray<unsigned_int>::SetCount(NgonMap,count);
      _ngonUnsetIndex = ON_SimpleArray<unsigned_int>::Array(NgonMap);
      for (ngon_vi.m_capacity = 0; (uint)ngon_vi.m_capacity < count;
          ngon_vi.m_capacity = ngon_vi.m_capacity + 1) {
        _ngonUnsetIndex[(uint)ngon_vi.m_capacity] = 0xffffffff;
      }
    }
    omitted_face_mark = uVar3;
    for (ngon_vi.m_capacity = 0; (uint)ngon_vi.m_capacity < count;
        ngon_vi.m_capacity = ngon_vi.m_capacity + 1) {
      if (_ngonUnsetIndex[(uint)ngon_vi.m_capacity] == 0xffffffff) {
        ON_MeshFaceList::QuadFvi(face_list,ngon_vi.m_capacity,&ngon_boundary_edge_count);
        bVar2 = GetFacePlaneEquation
                          (vertex_list,(bool)(ws_vfmap.m_p._3_1_ & 1),&ngon_boundary_edge_count,
                           planar_tolerance,(ON_PlaneEquation *)auStack_e8);
        if (bVar2) {
          Fvi[2] = 0;
          Fvi[3] = 0;
          local_108 = 0xffffffff;
          ngon_plane.plane_equation.d = (double)auStack_e8;
          e_00.y = e.x;
          e_00.x = (double)auStack_e8;
          e_00.z = e.y;
          e_00.d = e.z;
          uVar4 = GetCoplanarConnectedFaces
                            (vertex_list,face_list,omitted_face_mark,_ngonUnsetIndex,
                             (uint **)planar_tolerance_local,planar_tolerance,ngon_vi.m_capacity,
                             e_00,(ON_SimpleArray<unsigned_int> *)&ngon_nbr_map.m_count,
                             (ON_SimpleArray<NgonNeighbors> *)&e.d);
          if ((minimum_ngon_vertex_count <= uVar4) &&
             (uVar5 = ON_SimpleArray<unsigned_int>::UnsignedCount
                                ((ON_SimpleArray<unsigned_int> *)&ngon_nbr_map.m_count),
             minimum_ngon_face_count <= uVar5)) {
            ws_vfmap.m_p._4_4_ = ws_vfmap.m_p._4_4_ + 1;
            ON_SimpleArray<unsigned_int>::SetCount
                      ((ON_SimpleArray<unsigned_int> *)&ngon_fi.m_count,0);
            ngon_fi_count =
                 ON_SimpleArray<unsigned_int>::UnsignedCount
                           ((ON_SimpleArray<unsigned_int> *)&ngon_nbr_map.m_count);
            puVar7 = ON_SimpleArray<unsigned_int>::Array
                               ((ON_SimpleArray<unsigned_int> *)&ngon_nbr_map.m_count);
            uVar5 = ws_vfmap.m_p._4_4_;
            pNVar6 = ON_SimpleArray<NgonNeighbors>::Array((ON_SimpleArray<NgonNeighbors> *)&e.d);
            uVar5 = GetNgonBoundarySegments
                              (face_list,ngon_fi_count,puVar7,uVar5,pNVar6,
                               (ON_SimpleArray<unsigned_int> *)&ngon_fi.m_count,
                               (ON_SimpleArray<unsigned_int> *)0x0);
            if ((uVar5 != 0) &&
               (uVar5 = ON_SimpleArray<unsigned_int>::UnsignedCount
                                  ((ON_SimpleArray<unsigned_int> *)&ngon_fi.m_count),
               minimum_ngon_vertex_count <= uVar5)) {
              uVar5 = ON_SimpleArray<unsigned_int>::UnsignedCount
                                ((ON_SimpleArray<unsigned_int> *)&ngon_fi.m_count);
              if (uVar5 < uVar4) {
                puVar7 = ON_SimpleArray<unsigned_int>::operator[]
                                   ((ON_SimpleArray<unsigned_int> *)&ngon_fi.m_count,0);
                ON_3dPointListRef::operator[](&local_1d0,vertex_list,*puVar7);
                ON_PlaneEquation::UnitNormal
                          ((ON_3dVector *)&ngon_vi_area,(ON_PlaneEquation *)auStack_e8);
                ON_Plane::ON_Plane((ON_Plane *)local_1b8,&local_1d0,(ON_3dVector *)&ngon_vi_area);
                ngon_vi1._16_8_ =
                     Internal_NgonBoundaryArea
                               ((ON_Plane *)local_1b8,vertex_list,
                                (ON_SimpleArray<unsigned_int> *)&ngon_fi.m_count);
                do {
                  ON_SimpleArray<unsigned_int>::ON_SimpleArray
                            ((ON_SimpleArray<unsigned_int> *)local_208);
                  ws_vfmap.m_p._4_4_ = ws_vfmap.m_p._4_4_ + 1;
                  uVar5 = ON_SimpleArray<unsigned_int>::UnsignedCount
                                    ((ON_SimpleArray<unsigned_int> *)&ngon_nbr_map.m_count);
                  puVar7 = ON_SimpleArray<unsigned_int>::Array
                                     ((ON_SimpleArray<unsigned_int> *)&ngon_nbr_map.m_count);
                  uVar4 = ws_vfmap.m_p._4_4_;
                  pNVar6 = ON_SimpleArray<NgonNeighbors>::Array
                                     ((ON_SimpleArray<NgonNeighbors> *)&e.d);
                  uVar4 = GetNgonBoundarySegments
                                    (face_list,uVar5,puVar7,uVar4,pNVar6,
                                     (ON_SimpleArray<unsigned_int> *)local_208,
                                     (ON_SimpleArray<unsigned_int> *)0x0);
                  if (uVar4 == 0) {
                    ngon_vi1_area._4_4_ = 0xc;
                  }
                  else {
                    uVar4 = ON_SimpleArray<unsigned_int>::UnsignedCount
                                      ((ON_SimpleArray<unsigned_int> *)local_208);
                    if (uVar4 < 3) {
                      ngon_vi1_area._4_4_ = 0xc;
                    }
                    else {
                      dVar8 = Internal_NgonBoundaryArea
                                        ((ON_Plane *)local_1b8,vertex_list,
                                         (ON_SimpleArray<unsigned_int> *)local_208);
                      if ((double)ngon_vi1._16_8_ < dVar8) {
                        ngon_vi1._16_8_ = dVar8;
                        ON_SimpleArray<unsigned_int>::operator=
                                  ((ON_SimpleArray<unsigned_int> *)&ngon_fi.m_count,
                                   (ON_SimpleArray<unsigned_int> *)local_208);
                      }
                      ngon_vi1_area._4_4_ = 0;
                    }
                  }
                  ON_SimpleArray<unsigned_int>::~ON_SimpleArray
                            ((ON_SimpleArray<unsigned_int> *)local_208);
                } while (ngon_vi1_area._4_4_ == 0);
                if (bAllowHoles) {
                  ngon_vi1_area._4_4_ = 0;
                }
                else {
                  local_108 = 0xfffffffe;
                  bVar1 = true;
                  ngon_vi1_area._4_4_ = 10;
                }
                ON_Plane::~ON_Plane((ON_Plane *)local_1b8);
                if (ngon_vi1_area._4_4_ != 0) goto LAB_0075650c;
              }
              uVar4 = ON_SimpleArray<unsigned_int>::UnsignedCount
                                ((ON_SimpleArray<unsigned_int> *)&ngon_fi.m_count);
              uVar5 = ON_SimpleArray<unsigned_int>::UnsignedCount
                                ((ON_SimpleArray<unsigned_int> *)&ngon_nbr_map.m_count);
              Fvi._8_8_ = ON_MeshNgonAllocator::AllocateNgon(NgonAllocator,uVar4,uVar5);
              if ((ON_MeshNgon *)Fvi._8_8_ != (ON_MeshNgon *)0x0) {
                puVar7 = ((ON_MeshNgon *)Fvi._8_8_)->m_vi;
                __src = ON_SimpleArray<unsigned_int>::Array
                                  ((ON_SimpleArray<unsigned_int> *)&ngon_fi.m_count);
                memcpy(puVar7,__src,(ulong)*(uint *)Fvi._8_8_ << 2);
                __dest = *(void **)(Fvi._8_8_ + 0x10);
                puVar7 = ON_SimpleArray<unsigned_int>::Array
                                   ((ON_SimpleArray<unsigned_int> *)&ngon_nbr_map.m_count);
                memcpy(__dest,puVar7,(ulong)*(uint *)(Fvi._8_8_ + 4) << 2);
              }
            }
          }
LAB_0075650c:
          if (Fvi._8_8_ == 0) {
            puVar7 = ON_SimpleArray<unsigned_int>::Array
                               ((ON_SimpleArray<unsigned_int> *)&ngon_nbr_map.m_count);
            uVar4 = ON_SimpleArray<unsigned_int>::UnsignedCount
                              ((ON_SimpleArray<unsigned_int> *)&ngon_nbr_map.m_count);
            UnsetNgonMap(puVar7,uVar4,omitted_face_mark,local_108,_ngonUnsetIndex);
          }
          else {
            ON_SimpleArray<ON_MeshNgon_*>::Append(Ngons,(ON_MeshNgon **)(Fvi + 2));
            omitted_face_mark = omitted_face_mark + 1;
          }
        }
      }
    }
    if (bVar1) {
      for (ngon_vi.m_capacity = 0; (uint)ngon_vi.m_capacity < count;
          ngon_vi.m_capacity = ngon_vi.m_capacity + 1) {
        if (_ngonUnsetIndex[(uint)ngon_vi.m_capacity] == 0xfffffffe) {
          _ngonUnsetIndex[(uint)ngon_vi.m_capacity] = 0xffffffff;
        }
      }
    }
  }
  uVar4 = ON_SimpleArray<ON_MeshNgon_*>::UnsignedCount(Ngons);
  ON_SimpleArray<NgonNeighbors>::~ON_SimpleArray((ON_SimpleArray<NgonNeighbors> *)&e.d);
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray
            ((ON_SimpleArray<unsigned_int> *)&ngon_nbr_map.m_count);
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray((ON_SimpleArray<unsigned_int> *)&ngon_fi.m_count);
  ON_MeshVertexFaceMap::~ON_MeshVertexFaceMap((ON_MeshVertexFaceMap *)&ngon);
  return uVar4 - uVar3;
}

Assistant:

unsigned int ON_MeshNgon::FindPlanarNgons(
  const ON_3dPointListRef& vertex_list,
  const ON_MeshFaceList& face_list,
  const unsigned int *const* vertex_face_map,
  double planar_tolerance,
  unsigned int minimum_ngon_vertex_count,
  unsigned int minimum_ngon_face_count,
  bool bAllowHoles,
  ON_MeshNgonAllocator& NgonAllocator,
  ON_SimpleArray<unsigned int>& NgonMap,
  ON_SimpleArray<ON_MeshNgon*>& Ngons
  )
{
  const unsigned int NgonsCount0 = Ngons.UnsignedCount();
  const unsigned int vertex_count = vertex_list.PointCount();
  const unsigned int face_count = face_list.FaceCount();
  unsigned int ngon_boundary_index = 0;
  const bool bQuadFaces = (4 == face_list.FaceVertexCount());

  ON_MeshVertexFaceMap ws_vfmap;

  ON_MeshNgon* ngon;
  unsigned int Fvi[4];
  unsigned int face_index, ngon_boundary_edge_count;
  ON_SimpleArray<unsigned int> ngon_vi;
  ON_SimpleArray<unsigned int> ngon_fi;
  ON_SimpleArray<struct NgonNeighbors> ngon_nbr_map;
  ON_PlaneEquation e;

  bool bCleanUpNgonMap = false;

  for (;;)
  {
    if ( face_count <= 0 || face_count != NgonMap.UnsignedCount() )
      NgonMap.SetCount(0);

    if ( face_count <= 0 || vertex_count <= 0 )
      break;
   
    if ( 0 == vertex_face_map )
    {
      if ( !ws_vfmap.SetFromFaceList(vertex_count,face_list,false) )
        break;
      vertex_face_map = ws_vfmap.VertexFaceMap();
      if ( 0 == vertex_face_map )
        break;
    }

    ngon_vi.Reserve(128);
    ngon_fi.Reserve(128);
    ngon_nbr_map.Reserve(128);

    unsigned int* ngonMap = NgonMap.Array();
    if ( face_count != NgonMap.UnsignedCount() )
    {
      NgonMap.Reserve(face_count);
      NgonMap.SetCount(face_count);
      ngonMap = NgonMap.Array(); // in case a reallocation occurred.
      for ( face_index = 0; face_index < face_count; face_index++ )
        ngonMap[face_index] = ON_UNSET_UINT_INDEX;
    }

    int ngonIndex = NgonsCount0;
    unsigned int ngonUnsetIndex;
    const unsigned int omitted_face_mark = ON_UNSET_UINT_INDEX - 1;

    for ( face_index = 0; face_index < face_count; face_index++ )
    {
      if ( ON_UNSET_UINT_INDEX != ngonMap[face_index] )
        continue; // this face is not eligable for being in an n-gon

      face_list.QuadFvi(face_index,Fvi);
      if ( !GetFacePlaneEquation(vertex_list,bQuadFaces,Fvi,planar_tolerance,e) )
        continue; // degenerate face

      for (;;)
      {
        ngon = 0;
        ngonUnsetIndex = ON_UNSET_UINT_INDEX;

        // Note:
        //   ngon_boundary_count includes interior edges when the n-gon has holes
        ngon_boundary_edge_count = GetCoplanarConnectedFaces(
          vertex_list,
          face_list,
          ngonIndex, ngonMap, vertex_face_map,
          planar_tolerance, face_index, e, 
          ngon_fi,
          ngon_nbr_map
          );

        if ( ngon_boundary_edge_count < minimum_ngon_vertex_count )
          break;

        if ( ngon_fi.UnsignedCount() < minimum_ngon_face_count )
          break;

        ngon_boundary_index++;
        ngon_vi.SetCount(0);
        if ( !GetNgonBoundarySegments(face_list,
                            ngon_fi.UnsignedCount(),ngon_fi.Array(),
                            ngon_boundary_index,
                            ngon_nbr_map.Array(),
                            &ngon_vi,
                            0
                            ) 
           )
          break;

        if ( ngon_vi.UnsignedCount() < minimum_ngon_vertex_count )
          break;

        if ( ngon_vi.UnsignedCount() < ngon_boundary_edge_count )
        {
          // ngon has holes.
          // The boundary with the largest area is the outer boundary.
          const ON_Plane ngon_plane(vertex_list[ngon_vi[0]], e.UnitNormal());

          double ngon_vi_area = Internal_NgonBoundaryArea(ngon_plane, vertex_list, ngon_vi);

          for(;;)
          {
            ON_SimpleArray<unsigned int> ngon_vi1;
            ngon_boundary_index++;
            if ( !GetNgonBoundarySegments(face_list,
                                ngon_fi.UnsignedCount(),ngon_fi.Array(),
                                ngon_boundary_index,
                                ngon_nbr_map.Array(),
                                &ngon_vi1, 0) 
               )
              break;
            if ( ngon_vi1.UnsignedCount() < 3 )
              break;
            double ngon_vi1_area = Internal_NgonBoundaryArea(ngon_plane, vertex_list, ngon_vi1);
            if (ngon_vi1_area > ngon_vi_area)
            {
              ngon_vi_area = ngon_vi1_area;
              ngon_vi = ngon_vi1;
            }
          }

          if (false == bAllowHoles)
          {
            ngonUnsetIndex = omitted_face_mark;
            bCleanUpNgonMap = true;
            break;
          }
        }

        ngon = NgonAllocator.AllocateNgon(ngon_vi.UnsignedCount(),ngon_fi.UnsignedCount());
        if ( 0 == ngon )
          break;

        memcpy(ngon->m_vi,ngon_vi.Array(),ngon->m_Vcount*sizeof(ngon->m_vi[0]));
        memcpy(ngon->m_fi,ngon_fi.Array(),ngon->m_Fcount*sizeof(ngon->m_fi[0]));
        break; // finished new ngon
      }

      if (0 == ngon)
      {
        // undo any modifications that were made to ngonMap[]
        UnsetNgonMap(ngon_fi.Array(),ngon_fi.UnsignedCount(),ngonIndex,ngonUnsetIndex,ngonMap);
        continue;
      }

      // found a new ngon
      Ngons.Append(ngon);
      ngonIndex++;
    }
    if (bCleanUpNgonMap)
    {
      for (face_index = 0; face_index < face_count; face_index++)
      {
        if (omitted_face_mark == ngonMap[face_index])
          ngonMap[face_index] = ON_UNSET_UINT_INDEX;
      }
    }
    break;
  }



  return Ngons.UnsignedCount() - NgonsCount0;
}